

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall ocl::KernelSource::precompile(KernelSource *this,bool printLog)

{
  Context context;
  undefined1 local_40 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  gpu::Context::Context((Context *)(local_40 + 0x10));
  gpu::Context::cl((Context *)local_40);
  getKernel(this,(shared_ptr<ocl::OpenCLEngine> *)local_40,printLog);
  if ((element_type *)local_40._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

void KernelSource::precompile(bool printLog) {
	gpu::Context context;

	precompile(context.cl(), printLog);
}